

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc_error_estimator.cpp
# Opt level: O0

double __thiscall
ltc_error_estimator::estimate_partial_error
          (ltc_error_estimator *this,brdf *sample_source,brdf *other_brdf,vec2 *random_parameters)

{
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  double dVar1;
  double partial_error;
  double error3;
  double error1;
  float other_value;
  float source_value;
  float other_pdf;
  float source_pdf;
  undefined1 local_34 [8];
  vec3 light_dir;
  vec2 *random_parameters_local;
  brdf *other_brdf_local;
  brdf *sample_source_local;
  ltc_error_estimator *this_local;
  
  light_dir.field_0._4_8_ = random_parameters;
  (*sample_source->_vptr_brdf[4])(sample_source,&this->_view_dir,random_parameters);
  (*sample_source->_vptr_brdf[3])(sample_source,local_34,&this->_view_dir,&source_value);
  (*other_brdf->_vptr_brdf[3])(other_brdf,local_34,&this->_view_dir,&other_value);
  source_value = ABS(source_value);
  other_value = ABS(other_value);
  dVar1 = std::fabs((double)(ulong)(uint)(extraout_XMM0_Da - extraout_XMM0_Da_00));
  dVar1 = (double)SUB84(dVar1,0);
  return (dVar1 * dVar1 * dVar1) / (double)(source_value + other_value);
}

Assistant:

double ltc_error_estimator::estimate_partial_error(
  const brdf &sample_source,
  const brdf &other_brdf,
  const glm::vec2 &random_parameters
) const
{
  // Use Multiple Importance Sampling technique with balance heuristics used as weight function.

  const glm::vec3 light_dir = sample_source.sample(_view_dir, random_parameters);

  float source_pdf, other_pdf;

  auto source_value = sample_source.evaluate(light_dir, _view_dir, source_pdf);
  auto other_value = other_brdf.evaluate(light_dir, _view_dir, other_pdf);

  source_pdf = fabs(source_pdf);
  other_pdf = fabs(other_pdf);

  double error1 = std::fabs(source_value - other_value);
  auto error3 = error1 * error1 * error1;
  auto partial_error = error3 / (source_pdf + other_pdf);

  return partial_error;
}